

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetFunctionVariableUpvalueName(ExpressionContext *ctx,VariableData *variable)

{
  InplaceStr name_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FunctionData *pFVar5;
  undefined4 extraout_var;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *__dest_00;
  char *pos;
  char *name;
  uint nameLength;
  undefined1 local_50 [8];
  InplaceStr operatorName;
  InplaceStr functionName;
  FunctionData *function;
  VariableData *variable_local;
  ExpressionContext *ctx_local;
  char *__dest;
  
  pFVar5 = ExpressionContext::GetFunctionOwner(ctx,variable->scope);
  if (pFVar5 == (FunctionData *)0x0) {
    InplaceStr::InplaceStr((InplaceStr *)&operatorName.end,"global");
  }
  else {
    operatorName.end = (pFVar5->name->name).begin;
    functionName.begin = (pFVar5->name->name).end;
  }
  if ((((*operatorName.end < 'A') && (*operatorName.end != '$')) || (*operatorName.end == '|')) ||
     ((*operatorName.end == '^' || (*operatorName.end == '~')))) {
    name_00.end = functionName.begin;
    name_00.begin = operatorName.end;
    _local_50 = GetOperatorName(name_00);
    bVar1 = InplaceStr::empty((InplaceStr *)local_50);
    if (!bVar1) {
      operatorName.end = (char *)local_50;
    }
  }
  uVar2 = InplaceStr::length((InplaceStr *)&operatorName.end);
  uVar3 = InplaceStr::length(&variable->name->name);
  uVar2 = uVar2 + uVar3 + 0x19;
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar2);
  __dest = (char *)CONCAT44(extraout_var,iVar4);
  strcpy(__dest,"$upvalue_");
  pcVar7 = operatorName.end;
  pcVar6 = __dest + 9;
  uVar3 = InplaceStr::length((InplaceStr *)&operatorName.end);
  memcpy(pcVar6,pcVar7,(ulong)uVar3);
  uVar3 = InplaceStr::length((InplaceStr *)&operatorName.end);
  pcVar6 = pcVar6 + uVar3;
  __dest_00 = pcVar6 + 1;
  *pcVar6 = '_';
  pcVar7 = (variable->name->name).begin;
  uVar3 = InplaceStr::length(&variable->name->name);
  memcpy(__dest_00,pcVar7,(ulong)uVar3);
  uVar3 = InplaceStr::length(&variable->name->name);
  __dest_00[uVar3] = '_';
  pcVar7 = NameWriteUnsigned(__dest_00 + uVar3 + 1,variable->uniqueId);
  *pcVar7 = '\0';
  sVar8 = strlen(__dest);
  if (uVar2 <= sVar8) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x204,
                  "InplaceStr GetFunctionVariableUpvalueName(ExpressionContext &, VariableData *)");
  }
  InplaceStr::InplaceStr((InplaceStr *)&ctx_local,__dest);
  return _ctx_local;
}

Assistant:

InplaceStr GetFunctionVariableUpvalueName(ExpressionContext &ctx, VariableData *variable)
{
	FunctionData *function = ctx.GetFunctionOwner(variable->scope);

	InplaceStr functionName = function ? function->name->name : InplaceStr("global");

	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + variable->name->name.length() + 24 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	strcpy(pos, "$upvalue_");
	pos += strlen("$upvalue_");

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';

	memcpy(pos, variable->name->name.begin, variable->name->name.length());
	pos += variable->name->name.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, variable->uniqueId);

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}